

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

any __thiscall
cs_impl::any::make_protect<cs::object_method,cs_impl::any_const&,cs_impl::any&,bool>
          (any *this,any *args,any *args_1,bool *args_2)

{
  proxy *ppVar1;
  int local_28;
  int local_24;
  holder<cs::object_method> *local_20;
  
  local_28 = 1;
  local_24 = local_28;
  local_20 = cs::
             allocator_type<cs_impl::any::holder<cs::object_method>,64ul,cs_impl::default_allocator_provider>
             ::alloc<cs_impl::any_const&,cs_impl::any&,bool>
                       ((allocator_type<cs_impl::any::holder<cs::object_method>,64ul,cs_impl::default_allocator_provider>
                         *)holder<cs::object_method>::allocator,args,args_1,args_2);
  ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
           alloc<int,int,cs_impl::any::holder<cs::object_method>*>
                     ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>
                       *)allocator,&local_24,&local_28,&local_20);
  this->mDat = ppVar1;
  return (any)(proxy *)this;
}

Assistant:

static any make_protect(ArgsT &&...args)
		{
			return any(allocator.alloc(1, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}